

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  char *rhs_expression;
  AssertHelper *this_01;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_bucknum;
  key_type *in_stack_fffffffffffffe98;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea0;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  int iVar3;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffec0;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  undefined8 in_stack_fffffffffffffec8;
  Type type;
  AssertionResult local_100;
  value_type *in_stack_ffffffffffffff18;
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffff20;
  AssertionResult local_d0 [2];
  key_type local_b0;
  size_type local_a8;
  AssertionResult local_a0 [3];
  undefined1 local_68 [80];
  key_type local_18;
  type local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_18 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
  local_10 = (type)google::
                   BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
                   ::bucket(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_68._60_4_ = 0.0;
  local_68._48_8_ =
       google::
       BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
       ::bucket_size(in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,(uint *)in_stack_fffffffffffffea8,
             (unsigned_long *)in_stack_fffffffffffffea0);
  iVar3 = (int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_68 + 0x40));
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xc9657c);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffec0,iVar3,in_stack_fffffffffffffeb0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0xc965d9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9664a);
  pcVar2 = (char *)(in_RDI + 0x10);
  this_02 = (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             *)local_68;
  HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::UniqueObject(in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::pair<const_char_*const,_ValueType>::~pair((pair<const_char_*const,_ValueType> *)0xc96698);
  rhs_expression = (char *)(in_RDI + 0x10);
  local_b0 = HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(this_02,(int)((ulong)pcVar2 >> 0x20));
  local_a8 = google::
             BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (pcVar2,rhs_expression,(unsigned_long *)in_stack_fffffffffffffea8,
             (unsigned_long *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffea8 =
         (HashtableTest<google::HashtableInterface_DenseHashMap<const_char_*,_ValueType,_kEmptyCharStar,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc9676c);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)this_02,(int)((ulong)pcVar2 >> 0x20),rhs_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff20,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0xc967c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc96837);
  this_01 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_size(in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (pcVar2,rhs_expression,(uint *)in_stack_fffffffffffffea8,
             (unsigned_long *)in_stack_fffffffffffffea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffea0 =
         (BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xc968d1);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)this_02,(int)((ulong)pcVar2 >> 0x20),rhs_expression);
    testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0xc96925);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc96990);
  google::
  BaseHashtableInterface<google::dense_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffea0,(size_type)in_stack_fffffffffffffe98);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (pcVar2,rhs_expression,(uint *)in_stack_fffffffffffffea8,
             (unsigned_long *)in_stack_fffffffffffffea0);
  iVar3 = (int)((ulong)pcVar2 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0xc96a16);
    testing::internal::AssertHelper::AssertHelper(this_00,type,(char *)this_02,iVar3,rhs_expression)
    ;
    testing::internal::AssertHelper::operator=(this_01,(Message *)in_stack_ffffffffffffff18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffea0);
    testing::Message::~Message((Message *)0xc96a62);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc96ac4);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}